

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

void __thiscall diy::Link::fix(Link *this,Assigner *assigner)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  long *in_RSI;
  long in_RDI;
  uint i;
  uint local_14;
  
  local_14 = 0;
  while( true ) {
    sVar2 = std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::size
                      ((vector<diy::BlockID,_std::allocator<diy::BlockID>_> *)(in_RDI + 8));
    if (sVar2 <= local_14) break;
    pvVar3 = std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::operator[]
                       ((vector<diy::BlockID,_std::allocator<diy::BlockID>_> *)(in_RDI + 8),
                        (ulong)local_14);
    iVar1 = (**(code **)(*in_RSI + 0x18))(in_RSI,pvVar3->gid);
    pvVar3 = std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::operator[]
                       ((vector<diy::BlockID,_std::allocator<diy::BlockID>_> *)(in_RDI + 8),
                        (ulong)local_14);
    pvVar3->proc = iVar1;
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void      fix(const Assigner& assigner)       { for (unsigned i = 0; i < neighbors_.size(); ++i) { neighbors_[i].proc = assigner.rank(neighbors_[i].gid); } }